

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::PerfEvents_Tracepoint::~PerfEvents_Tracepoint(PerfEvents_Tracepoint *this)

{
  PerfEvents_Tracepoint *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__PerfEvents_Tracepoint_009c0ea8;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  ::std::__cxx11::string::~string((string *)&this->filter_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

PerfEvents_Tracepoint::~PerfEvents_Tracepoint() = default;